

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conelinei_intersector.h
# Opt level: O3

bool embree::avx::ConeCurveMiIntersectorK<4,_4,_true>::occluded
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *line)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  Geometry *pGVar7;
  long lVar8;
  RTCFilterFunctionN p_Var9;
  ulong uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  uint uVar25;
  byte bVar26;
  bool bVar27;
  undefined1 (*pauVar28) [16];
  Scene *pSVar29;
  ulong uVar30;
  float fVar31;
  float fVar38;
  float fVar39;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar40;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar41;
  undefined8 extraout_XMM1_Qa;
  float fVar51;
  float fVar52;
  float fVar53;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 extraout_var [56];
  float fVar54;
  float fVar65;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  float fVar81;
  float fVar84;
  float fVar85;
  undefined1 auVar82 [16];
  float fVar86;
  undefined1 auVar83 [16];
  float fVar87;
  float fVar94;
  float fVar95;
  float fVar96;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  float fVar97;
  float fVar115;
  float fVar116;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [64];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [64];
  float fVar121;
  float fVar122;
  float fVar126;
  float fVar127;
  float fVar128;
  float fVar129;
  float fVar130;
  float fVar131;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [64];
  float fVar132;
  float fVar136;
  float fVar137;
  undefined1 auVar133 [16];
  float fVar138;
  undefined1 auVar134 [16];
  undefined1 auVar135 [64];
  undefined1 auVar139 [16];
  undefined1 auVar140 [64];
  float fVar141;
  float fVar142;
  float fVar145;
  float fVar146;
  float fVar147;
  undefined1 auVar143 [16];
  undefined1 auVar144 [64];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [64];
  RTCFilterFunctionNArguments args;
  RoundLineIntersectorHitM<4> hit;
  undefined1 local_368 [8];
  float fStack_360;
  float fStack_35c;
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  undefined8 local_328;
  float fStack_320;
  float fStack_31c;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  undefined1 local_308 [8];
  float fStack_300;
  float fStack_2fc;
  undefined1 local_2f8 [16];
  Scene *local_2e0;
  RTCFilterFunctionNArguments local_2d8;
  undefined1 local_2a8 [8];
  float fStack_2a0;
  float fStack_29c;
  undefined1 local_298 [16];
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  undefined1 local_278 [16];
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_248 [16];
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [16];
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  undefined1 local_1d8 [16];
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [8];
  float fStack_190;
  float fStack_18c;
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  RTCHitN local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined4 local_128;
  undefined4 uStack_124;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  uint local_e8;
  uint uStack_e4;
  uint uStack_e0;
  uint uStack_dc;
  uint uStack_d8;
  uint uStack_d4;
  uint uStack_d0;
  uint uStack_cc;
  undefined1 local_c8 [16];
  undefined1 local_b8 [8];
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  pSVar29 = context->scene;
  uVar25 = (line->v0).field_0.i[0];
  pGVar7 = (pSVar29->geometries).items[line->sharedGeomID].ptr;
  lVar8 = *(long *)&pGVar7[1].time_range.upper;
  p_Var9 = pGVar7[1].intersectionFilterN;
  auVar32 = *(undefined1 (*) [16])(lVar8 + (ulong)uVar25 * (long)p_Var9);
  uVar4 = (line->v0).field_0.i[1];
  auVar36 = *(undefined1 (*) [16])(lVar8 + (ulong)uVar4 * (long)p_Var9);
  uVar5 = (line->v0).field_0.i[2];
  auVar44 = *(undefined1 (*) [16])(lVar8 + (ulong)uVar5 * (long)p_Var9);
  uVar6 = (line->v0).field_0.i[3];
  auVar45 = *(undefined1 (*) [16])(lVar8 + (ulong)uVar6 * (long)p_Var9);
  auVar102 = vunpcklps_avx(auVar32,auVar44);
  auVar32 = vunpckhps_avx(auVar32,auVar44);
  auVar44 = vunpcklps_avx(auVar36,auVar45);
  auVar36 = vunpckhps_avx(auVar36,auVar45);
  auVar99 = vunpcklps_avx(auVar102,auVar44);
  auVar58 = vunpckhps_avx(auVar102,auVar44);
  auVar100 = vunpcklps_avx(auVar32,auVar36);
  auVar59 = vunpckhps_avx(auVar32,auVar36);
  auVar32 = *(undefined1 (*) [16])(lVar8 + (ulong)(uVar25 + 1) * (long)p_Var9);
  auVar36 = *(undefined1 (*) [16])(lVar8 + (ulong)(uVar4 + 1) * (long)p_Var9);
  auVar44 = *(undefined1 (*) [16])(lVar8 + (ulong)(uVar5 + 1) * (long)p_Var9);
  auVar45 = *(undefined1 (*) [16])(lVar8 + (ulong)(uVar6 + 1) * (long)p_Var9);
  auVar102 = vpunpckldq_avx(auVar32,auVar44);
  auVar32 = vpunpckhdq_avx(auVar32,auVar44);
  auVar44 = vpunpckldq_avx(auVar36,auVar45);
  auVar36 = vpunpckhdq_avx(auVar36,auVar45);
  auVar80 = vpunpckldq_avx(auVar102,auVar44);
  auVar44 = vpunpckhdq_avx(auVar102,auVar44);
  auVar102 = vpunpckldq_avx(auVar32,auVar36);
  auVar45 = vpunpckhdq_avx(auVar32,auVar36);
  auVar32 = vpcmpeqd_avx(auVar45,auVar45);
  auVar36 = vpcmpeqd_avx(auVar32,(undefined1  [16])(line->primIDs).field_0);
  local_98 = vpshufd_avx(ZEXT416(line->sharedGeomID),0);
  local_1c8 = *(float *)(ray + k * 4 + 0x40);
  local_a8 = *(float *)(ray + k * 4 + 0x50);
  local_1e8 = *(float *)(ray + k * 4 + 0x60);
  auVar32 = ZEXT416((uint)(local_1c8 * local_1c8 + local_a8 * local_a8 + local_1e8 * local_1e8));
  auVar57 = vshufps_avx(auVar32,auVar32,0);
  auVar32 = vrcpps_avx(auVar57);
  fVar41 = auVar32._0_4_;
  auVar33._0_4_ = fVar41 * auVar57._0_4_;
  fVar51 = auVar32._4_4_;
  auVar33._4_4_ = fVar51 * auVar57._4_4_;
  fVar52 = auVar32._8_4_;
  auVar33._8_4_ = fVar52 * auVar57._8_4_;
  fVar53 = auVar32._12_4_;
  auVar33._12_4_ = fVar53 * auVar57._12_4_;
  auVar32._8_4_ = 0x3f800000;
  auVar32._0_8_ = 0x3f8000003f800000;
  auVar32._12_4_ = 0x3f800000;
  auVar32 = vsubps_avx(auVar32,auVar33);
  auVar42._0_4_ = (auVar80._0_4_ + auVar99._0_4_) * 0.5;
  auVar42._4_4_ = (auVar80._4_4_ + auVar99._4_4_) * 0.5;
  auVar42._8_4_ = (auVar80._8_4_ + auVar99._8_4_) * 0.5;
  auVar42._12_4_ = (auVar80._12_4_ + auVar99._12_4_) * 0.5;
  auVar66._0_4_ = (auVar44._0_4_ + auVar58._0_4_) * 0.5;
  auVar66._4_4_ = (auVar44._4_4_ + auVar58._4_4_) * 0.5;
  auVar66._8_4_ = (auVar44._8_4_ + auVar58._8_4_) * 0.5;
  auVar66._12_4_ = (auVar44._12_4_ + auVar58._12_4_) * 0.5;
  auVar55._0_4_ = (auVar100._0_4_ + auVar102._0_4_) * 0.5;
  auVar55._4_4_ = (auVar100._4_4_ + auVar102._4_4_) * 0.5;
  auVar55._8_4_ = (auVar100._8_4_ + auVar102._8_4_) * 0.5;
  auVar55._12_4_ = (auVar100._12_4_ + auVar102._12_4_) * 0.5;
  fVar97 = *(float *)(ray + k * 4 + 0x10);
  auVar82._4_4_ = fVar97;
  auVar82._0_4_ = fVar97;
  auVar82._8_4_ = fVar97;
  auVar82._12_4_ = fVar97;
  auVar57 = vsubps_avx(auVar66,auVar82);
  fVar115 = *(float *)(ray + k * 4 + 0x20);
  auVar98._4_4_ = fVar115;
  auVar98._0_4_ = fVar115;
  auVar98._8_4_ = fVar115;
  auVar98._12_4_ = fVar115;
  auVar33 = vsubps_avx(auVar55,auVar98);
  fVar116 = *(float *)(ray + k * 4);
  auVar67._4_4_ = fVar116;
  auVar67._0_4_ = fVar116;
  auVar67._8_4_ = fVar116;
  auVar67._12_4_ = fVar116;
  auVar42 = vsubps_avx(auVar42,auVar67);
  fVar54 = (local_1c8 * auVar42._0_4_ + local_a8 * auVar57._0_4_ + local_1e8 * auVar33._0_4_) *
           (fVar41 + fVar41 * auVar32._0_4_);
  fVar65 = (local_1c8 * auVar42._4_4_ + local_a8 * auVar57._4_4_ + local_1e8 * auVar33._4_4_) *
           (fVar51 + fVar51 * auVar32._4_4_);
  fStack_320 = (local_1c8 * auVar42._8_4_ + local_a8 * auVar57._8_4_ + local_1e8 * auVar33._8_4_) *
               (fVar52 + fVar52 * auVar32._8_4_);
  fStack_31c = (local_1c8 * auVar42._12_4_ + local_a8 * auVar57._12_4_ + local_1e8 * auVar33._12_4_)
               * (fVar53 + fVar53 * auVar32._12_4_);
  auVar68._0_4_ = fVar116 + local_1c8 * fVar54;
  auVar68._4_4_ = fVar116 + local_1c8 * fVar65;
  auVar68._8_4_ = fVar116 + local_1c8 * fStack_320;
  auVar68._12_4_ = fVar116 + local_1c8 * fStack_31c;
  auVar148._0_4_ = fVar97 + local_a8 * fVar54;
  auVar148._4_4_ = fVar97 + local_a8 * fVar65;
  auVar148._8_4_ = fVar97 + local_a8 * fStack_320;
  auVar148._12_4_ = fVar97 + local_a8 * fStack_31c;
  local_328 = (undefined1 (*) [16])CONCAT44(fVar65,fVar54);
  auVar56._0_4_ = fVar115 + local_1e8 * fVar54;
  auVar56._4_4_ = fVar115 + local_1e8 * fVar65;
  auVar56._8_4_ = fVar115 + local_1e8 * fStack_320;
  auVar56._12_4_ = fVar115 + local_1e8 * fStack_31c;
  local_248 = vsubps_avx(auVar44,auVar58);
  local_258 = vsubps_avx(auVar102,auVar100);
  fVar97 = local_258._0_4_;
  fVar52 = local_258._4_4_;
  fVar13 = local_258._8_4_;
  fVar18 = local_258._12_4_;
  fVar115 = local_248._0_4_;
  fVar53 = local_248._4_4_;
  fVar14 = local_248._8_4_;
  fVar19 = local_248._12_4_;
  local_1d8 = vsubps_avx(auVar80,auVar99);
  fVar116 = local_1d8._0_4_;
  fVar141 = local_1d8._4_4_;
  fVar15 = local_1d8._8_4_;
  fVar20 = local_1d8._12_4_;
  fVar31 = fVar116 * fVar116 + fVar115 * fVar115 + fVar97 * fVar97;
  fVar38 = fVar141 * fVar141 + fVar53 * fVar53 + fVar52 * fVar52;
  fVar39 = fVar15 * fVar15 + fVar14 * fVar14 + fVar13 * fVar13;
  fVar40 = fVar20 * fVar20 + fVar19 * fVar19 + fVar18 * fVar18;
  local_268 = vsubps_avx(auVar148,auVar58);
  local_278 = vsubps_avx(auVar56,auVar100);
  fVar41 = local_278._0_4_;
  fVar11 = local_278._4_4_;
  fVar16 = local_278._8_4_;
  fVar21 = local_278._12_4_;
  fVar142 = local_268._0_4_;
  fVar145 = local_268._4_4_;
  fVar146 = local_268._8_4_;
  fVar147 = local_268._12_4_;
  local_2f8 = vsubps_avx(auVar68,auVar99);
  fVar121 = local_2f8._0_4_;
  fVar126 = local_2f8._4_4_;
  fVar128 = local_2f8._8_4_;
  fVar130 = local_2f8._12_4_;
  fVar81 = fVar121 * fVar116 + fVar142 * fVar115 + fVar97 * fVar41;
  fVar84 = fVar126 * fVar141 + fVar145 * fVar53 + fVar52 * fVar11;
  fVar85 = fVar128 * fVar15 + fVar146 * fVar14 + fVar13 * fVar16;
  fVar86 = fVar130 * fVar20 + fVar147 * fVar19 + fVar18 * fVar21;
  auVar139._0_4_ = local_1c8 * fVar116 + local_a8 * fVar115 + fVar97 * local_1e8;
  auVar139._4_4_ = local_1c8 * fVar141 + local_a8 * fVar53 + fVar52 * local_1e8;
  auVar139._8_4_ = local_1c8 * fVar15 + local_a8 * fVar14 + fVar13 * local_1e8;
  auVar139._12_4_ = local_1c8 * fVar20 + local_a8 * fVar19 + fVar18 * local_1e8;
  fStack_a4 = local_a8;
  fStack_a0 = local_a8;
  fStack_9c = local_a8;
  auVar32 = vsubps_avx(auVar59,auVar45);
  fVar51 = auVar32._0_4_;
  fVar12 = auVar32._4_4_;
  fVar17 = auVar32._8_4_;
  fVar22 = auVar32._12_4_;
  fVar87 = fVar51 * fVar51 + fVar31;
  fVar94 = fVar12 * fVar12 + fVar38;
  fVar95 = fVar17 * fVar17 + fVar39;
  fVar96 = fVar22 * fVar22 + fVar40;
  local_b8._0_4_ = fVar31 * fVar31;
  local_b8._4_4_ = fVar38 * fVar38;
  fStack_b0 = fVar39 * fVar39;
  fStack_ac = fVar40 * fVar40;
  auVar57._0_4_ =
       (float)local_b8._0_4_ * (local_1c8 * fVar121 + local_a8 * fVar142 + local_1e8 * fVar41);
  auVar57._4_4_ =
       (float)local_b8._4_4_ * (local_1c8 * fVar126 + local_a8 * fVar145 + local_1e8 * fVar11);
  auVar57._8_4_ = fStack_b0 * (local_1c8 * fVar128 + local_a8 * fVar146 + local_1e8 * fVar16);
  auVar57._12_4_ = fStack_ac * (local_1c8 * fVar130 + local_a8 * fVar147 + local_1e8 * fVar21);
  auVar117._0_4_ = auVar139._0_4_ * fVar81 * fVar87;
  auVar117._4_4_ = auVar139._4_4_ * fVar84 * fVar94;
  auVar117._8_4_ = auVar139._8_4_ * fVar85 * fVar95;
  auVar117._12_4_ = auVar139._12_4_ * fVar86 * fVar96;
  auVar32 = vsubps_avx(auVar57,auVar117);
  local_208 = auVar59._0_4_;
  auVar118._0_4_ = local_208 * fVar31;
  fStack_204 = auVar59._4_4_;
  auVar118._4_4_ = fStack_204 * fVar38;
  fStack_200 = auVar59._8_4_;
  auVar118._8_4_ = fStack_200 * fVar39;
  fStack_1fc = auVar59._12_4_;
  auVar118._12_4_ = fStack_1fc * fVar40;
  auVar143._0_4_ = auVar118._0_4_ * auVar139._0_4_ * fVar51 + auVar32._0_4_;
  auVar143._4_4_ = auVar118._4_4_ * auVar139._4_4_ * fVar12 + auVar32._4_4_;
  auVar143._8_4_ = auVar118._8_4_ * auVar139._8_4_ * fVar17 + auVar32._8_4_;
  auVar143._12_4_ = auVar118._12_4_ * auVar139._12_4_ * fVar22 + auVar32._12_4_;
  auVar58._0_4_ = (float)local_b8._0_4_ * (fVar121 * fVar121 + fVar142 * fVar142 + fVar41 * fVar41);
  auVar58._4_4_ = (float)local_b8._4_4_ * (fVar126 * fVar126 + fVar145 * fVar145 + fVar11 * fVar11);
  auVar58._8_4_ = fStack_b0 * (fVar128 * fVar128 + fVar146 * fVar146 + fVar16 * fVar16);
  auVar58._12_4_ = fStack_ac * (fVar130 * fVar130 + fVar147 * fVar147 + fVar21 * fVar21);
  auVar99._0_4_ = fVar87 * fVar81 * fVar81;
  auVar99._4_4_ = fVar94 * fVar84 * fVar84;
  auVar99._8_4_ = fVar95 * fVar85 * fVar85;
  auVar99._12_4_ = fVar96 * fVar86 * fVar86;
  auVar32 = vsubps_avx(auVar58,auVar99);
  auVar100._0_4_ = (fVar51 + fVar51) * fVar81;
  auVar100._4_4_ = (fVar12 + fVar12) * fVar84;
  auVar100._8_4_ = (fVar17 + fVar17) * fVar85;
  auVar100._12_4_ = (fVar22 + fVar22) * fVar86;
  auVar57 = vsubps_avx(auVar100,auVar118);
  fVar122 = auVar139._0_4_ * auVar139._0_4_;
  fVar127 = auVar139._4_4_ * auVar139._4_4_;
  fVar129 = auVar139._8_4_ * auVar139._8_4_;
  fVar131 = auVar139._12_4_ * auVar139._12_4_;
  auVar59._0_4_ = fVar122 * fVar87;
  auVar59._4_4_ = fVar127 * fVar94;
  auVar59._8_4_ = fVar129 * fVar95;
  auVar59._12_4_ = fVar131 * fVar96;
  auVar33 = vsubps_avx(_local_b8,auVar59);
  auVar101._0_4_ = auVar33._0_4_ * (auVar32._0_4_ + auVar118._0_4_ * auVar57._0_4_);
  auVar101._4_4_ = auVar33._4_4_ * (auVar32._4_4_ + auVar118._4_4_ * auVar57._4_4_);
  auVar101._8_4_ = auVar33._8_4_ * (auVar32._8_4_ + auVar118._8_4_ * auVar57._8_4_);
  auVar101._12_4_ = auVar33._12_4_ * (auVar32._12_4_ + auVar118._12_4_ * auVar57._12_4_);
  auVar119._0_4_ = auVar143._0_4_ * auVar143._0_4_;
  auVar119._4_4_ = auVar143._4_4_ * auVar143._4_4_;
  auVar119._8_4_ = auVar143._8_4_ * auVar143._8_4_;
  auVar119._12_4_ = auVar143._12_4_ * auVar143._12_4_;
  auVar57 = vsubps_avx(auVar119,auVar101);
  auVar58 = ZEXT816(0) << 0x40;
  auVar32 = vcmpps_avx(auVar57,auVar58,5);
  auVar42 = auVar32 & ~auVar36;
  if ((((auVar42 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
       (auVar42 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar42 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar42[0xf] < '\0') {
    auVar42 = vandnps_avx(auVar36,auVar32);
    auVar80 = vsubps_avx(auVar68,auVar80);
    auVar59 = vsubps_avx(auVar148,auVar44);
    auVar99 = vsubps_avx(auVar56,auVar102);
    auVar36 = vsqrtps_avx(auVar57);
    auVar32 = vrcpps_avx(auVar33);
    fVar132 = auVar32._0_4_;
    auVar133._0_4_ = auVar33._0_4_ * fVar132;
    fVar136 = auVar32._4_4_;
    auVar133._4_4_ = auVar33._4_4_ * fVar136;
    fVar137 = auVar32._8_4_;
    auVar133._8_4_ = auVar33._8_4_ * fVar137;
    fVar138 = auVar32._12_4_;
    auVar133._12_4_ = auVar33._12_4_ * fVar138;
    auVar71._8_4_ = 0x3f800000;
    auVar71._0_8_ = 0x3f8000003f800000;
    auVar71._12_4_ = 0x3f800000;
    auVar32 = vsubps_avx(auVar71,auVar133);
    fVar132 = auVar32._0_4_ * fVar132 + fVar132;
    fVar136 = auVar32._4_4_ * fVar136 + fVar136;
    fVar137 = auVar32._8_4_ * fVar137 + fVar137;
    fVar138 = auVar32._12_4_ * fVar138 + fVar138;
    auVar102._8_4_ = 0x7fffffff;
    auVar102._0_8_ = 0x7fffffff7fffffff;
    auVar102._12_4_ = 0x7fffffff;
    auVar32 = vandps_avx(auVar33,auVar102);
    auVar103._8_4_ = 0x219392ef;
    auVar103._0_8_ = 0x219392ef219392ef;
    auVar103._12_4_ = 0x219392ef;
    auVar32 = vcmpps_avx(auVar32,auVar103,2);
    uVar30 = CONCAT44(auVar143._4_4_,auVar143._0_4_);
    auVar104._0_8_ = uVar30 ^ 0x8000000080000000;
    auVar104._8_4_ = -auVar143._8_4_;
    auVar104._12_4_ = -auVar143._12_4_;
    auVar44 = vsubps_avx(auVar104,auVar36);
    auVar36 = vsubps_avx(auVar36,auVar143);
    auVar105._0_4_ = fVar132 * auVar44._0_4_;
    auVar105._4_4_ = fVar136 * auVar44._4_4_;
    auVar105._8_4_ = fVar137 * auVar44._8_4_;
    auVar105._12_4_ = fVar138 * auVar44._12_4_;
    auVar123._0_4_ = auVar36._0_4_ * fVar132;
    auVar123._4_4_ = auVar36._4_4_ * fVar136;
    auVar123._8_4_ = auVar36._8_4_ * fVar137;
    auVar123._12_4_ = auVar36._12_4_ * fVar138;
    auVar34._8_4_ = 0xff800000;
    auVar34._0_8_ = 0xff800000ff800000;
    auVar34._12_4_ = 0xff800000;
    auVar36 = vblendvps_avx(auVar105,auVar34,auVar32);
    auVar134._8_4_ = 0x7f800000;
    auVar134._0_8_ = 0x7f8000007f800000;
    auVar134._12_4_ = 0x7f800000;
    auVar44 = vblendvps_avx(auVar123,auVar134,auVar32);
    auVar35._0_4_ = auVar139._0_4_ * auVar36._0_4_ + fVar81;
    auVar35._4_4_ = auVar139._4_4_ * auVar36._4_4_ + fVar84;
    auVar35._8_4_ = auVar139._8_4_ * auVar36._8_4_ + fVar85;
    auVar35._12_4_ = auVar139._12_4_ * auVar36._12_4_ + fVar86;
    auVar32 = vcmpps_avx(auVar35,auVar58,6);
    auVar23._4_4_ = fVar38;
    auVar23._0_4_ = fVar31;
    auVar23._8_4_ = fVar39;
    auVar23._12_4_ = fVar40;
    auVar102 = vcmpps_avx(auVar35,auVar23,1);
    auVar32 = vandps_avx(auVar32,auVar102);
    auVar32 = vandps_avx(auVar42,auVar32);
    auVar102 = vblendvps_avx(auVar134,auVar36,auVar32);
    local_2a8._0_4_ = fVar81 + auVar139._0_4_ * auVar44._0_4_;
    local_2a8._4_4_ = fVar84 + auVar139._4_4_ * auVar44._4_4_;
    fStack_2a0 = fVar85 + auVar139._8_4_ * auVar44._8_4_;
    fStack_29c = fVar86 + auVar139._12_4_ * auVar44._12_4_;
    auVar32 = vcmpps_avx(_local_2a8,auVar58,6);
    auVar36 = vcmpps_avx(_local_2a8,auVar23,1);
    auVar32 = vandps_avx(auVar36,auVar32);
    auVar32 = vandps_avx(auVar42,auVar32);
    local_298 = vblendvps_avx(auVar34,auVar44,auVar32);
    auVar32 = vrcpps_avx(auVar139);
    fVar132 = auVar32._0_4_;
    auVar106._0_4_ = auVar139._0_4_ * fVar132;
    fVar136 = auVar32._4_4_;
    auVar106._4_4_ = auVar139._4_4_ * fVar136;
    fVar137 = auVar32._8_4_;
    auVar106._8_4_ = auVar139._8_4_ * fVar137;
    fVar138 = auVar32._12_4_;
    auVar106._12_4_ = auVar139._12_4_ * fVar138;
    auVar32 = vsubps_avx(auVar71,auVar106);
    fVar132 = fVar132 + fVar132 * auVar32._0_4_;
    fVar136 = fVar136 + fVar136 * auVar32._4_4_;
    fVar137 = fVar137 + fVar137 * auVar32._8_4_;
    fVar138 = fVar138 + fVar138 * auVar32._12_4_;
    auVar88._0_4_ = auVar139._0_4_ * fVar121;
    auVar88._4_4_ = auVar139._4_4_ * fVar126;
    auVar88._8_4_ = auVar139._8_4_ * fVar128;
    auVar88._12_4_ = auVar139._12_4_ * fVar130;
    auVar107._0_4_ = local_1c8 * fVar81;
    auVar107._4_4_ = local_1c8 * fVar84;
    auVar107._8_4_ = local_1c8 * fVar85;
    auVar107._12_4_ = local_1c8 * fVar86;
    auVar32 = vsubps_avx(auVar88,auVar107);
    auVar108._0_4_ = auVar139._0_4_ * fVar142;
    auVar108._4_4_ = auVar139._4_4_ * fVar145;
    auVar108._8_4_ = auVar139._8_4_ * fVar146;
    auVar108._12_4_ = auVar139._12_4_ * fVar147;
    auVar149._0_4_ = local_a8 * fVar81;
    auVar149._4_4_ = local_a8 * fVar84;
    auVar149._8_4_ = local_a8 * fVar85;
    auVar149._12_4_ = local_a8 * fVar86;
    auVar36 = vsubps_avx(auVar108,auVar149);
    auVar150._0_4_ = auVar139._0_4_ * fVar41;
    auVar150._4_4_ = auVar139._4_4_ * fVar11;
    auVar150._8_4_ = auVar139._8_4_ * fVar16;
    auVar150._12_4_ = auVar139._12_4_ * fVar21;
    auVar72._0_4_ = local_1e8 * fVar81;
    auVar72._4_4_ = local_1e8 * fVar84;
    auVar72._8_4_ = local_1e8 * fVar85;
    auVar72._12_4_ = local_1e8 * fVar86;
    auVar44 = vsubps_avx(auVar150,auVar72);
    auVar73._0_4_ =
         auVar32._0_4_ * auVar32._0_4_ +
         auVar36._0_4_ * auVar36._0_4_ + auVar44._0_4_ * auVar44._0_4_;
    auVar73._4_4_ =
         auVar32._4_4_ * auVar32._4_4_ +
         auVar36._4_4_ * auVar36._4_4_ + auVar44._4_4_ * auVar44._4_4_;
    auVar73._8_4_ =
         auVar32._8_4_ * auVar32._8_4_ +
         auVar36._8_4_ * auVar36._8_4_ + auVar44._8_4_ * auVar44._8_4_;
    auVar73._12_4_ =
         auVar32._12_4_ * auVar32._12_4_ +
         auVar36._12_4_ * auVar36._12_4_ + auVar44._12_4_ * auVar44._12_4_;
    auVar89._0_4_ = local_208 * local_208 * fVar122;
    auVar89._4_4_ = fStack_204 * fStack_204 * fVar127;
    auVar89._8_4_ = fStack_200 * fStack_200 * fVar129;
    auVar89._12_4_ = fStack_1fc * fStack_1fc * fVar131;
    auVar32 = vcmpps_avx(auVar73,auVar89,1);
    auVar90._0_4_ = fVar132 * -fVar81;
    auVar90._4_4_ = fVar136 * -fVar84;
    auVar90._8_4_ = fVar137 * -fVar85;
    auVar90._12_4_ = fVar138 * -fVar86;
    auVar36 = vblendvps_avx(auVar134,auVar90,auVar32);
    local_368._0_4_ = auVar80._0_4_;
    local_368._4_4_ = auVar80._4_4_;
    fStack_360 = auVar80._8_4_;
    fStack_35c = auVar80._12_4_;
    fVar81 = (float)local_368._0_4_ * fVar116 + auVar59._0_4_ * fVar115 + auVar99._0_4_ * fVar97;
    fVar84 = (float)local_368._4_4_ * fVar141 + auVar59._4_4_ * fVar53 + auVar99._4_4_ * fVar52;
    fVar85 = fStack_360 * fVar15 + auVar59._8_4_ * fVar14 + auVar99._8_4_ * fVar13;
    fVar86 = fStack_35c * fVar20 + auVar59._12_4_ * fVar19 + auVar99._12_4_ * fVar18;
    auVar32 = vandnps_avx(*(undefined1 (*) [16])(mm_lookupmask_ps + (ulong)line->leftExists * 0x10),
                          auVar42);
    auVar80 = vblendvps_avx(auVar134,auVar36,auVar32);
    auVar36._0_4_ = auVar139._0_4_ * (float)local_368._0_4_;
    auVar36._4_4_ = auVar139._4_4_ * (float)local_368._4_4_;
    auVar36._8_4_ = auVar139._8_4_ * fStack_360;
    auVar36._12_4_ = auVar139._12_4_ * fStack_35c;
    auVar69._0_4_ = auVar139._0_4_ * auVar59._0_4_;
    auVar69._4_4_ = auVar139._4_4_ * auVar59._4_4_;
    auVar69._8_4_ = auVar139._8_4_ * auVar59._8_4_;
    auVar69._12_4_ = auVar139._12_4_ * auVar59._12_4_;
    auVar43._0_4_ = auVar139._0_4_ * auVar99._0_4_;
    auVar43._4_4_ = auVar139._4_4_ * auVar99._4_4_;
    auVar43._8_4_ = auVar139._8_4_ * auVar99._8_4_;
    auVar43._12_4_ = auVar139._12_4_ * auVar99._12_4_;
    auVar74._0_4_ = local_1c8 * fVar81;
    auVar74._4_4_ = local_1c8 * fVar84;
    auVar74._8_4_ = local_1c8 * fVar85;
    auVar74._12_4_ = local_1c8 * fVar86;
    auVar36 = vsubps_avx(auVar36,auVar74);
    auVar75._0_4_ = local_a8 * fVar81;
    auVar75._4_4_ = local_a8 * fVar84;
    auVar75._8_4_ = local_a8 * fVar85;
    auVar75._12_4_ = local_a8 * fVar86;
    auVar44 = vsubps_avx(auVar69,auVar75);
    auVar76._0_4_ = local_1e8 * fVar81;
    auVar76._4_4_ = local_1e8 * fVar84;
    auVar76._8_4_ = local_1e8 * fVar85;
    auVar76._12_4_ = local_1e8 * fVar86;
    auVar57 = vsubps_avx(auVar43,auVar76);
    auVar32 = vandnps_avx(*(undefined1 (*) [16])(mm_lookupmask_ps + (ulong)line->rightExists * 0x10)
                          ,auVar42);
    auVar37._0_4_ =
         auVar36._0_4_ * auVar36._0_4_ +
         auVar44._0_4_ * auVar44._0_4_ + auVar57._0_4_ * auVar57._0_4_;
    auVar37._4_4_ =
         auVar36._4_4_ * auVar36._4_4_ +
         auVar44._4_4_ * auVar44._4_4_ + auVar57._4_4_ * auVar57._4_4_;
    auVar37._8_4_ =
         auVar36._8_4_ * auVar36._8_4_ +
         auVar44._8_4_ * auVar44._8_4_ + auVar57._8_4_ * auVar57._8_4_;
    auVar37._12_4_ =
         auVar36._12_4_ * auVar36._12_4_ +
         auVar44._12_4_ * auVar44._12_4_ + auVar57._12_4_ * auVar57._12_4_;
    local_308._0_4_ = auVar45._0_4_;
    local_308._4_4_ = auVar45._4_4_;
    fStack_300 = auVar45._8_4_;
    fStack_2fc = auVar45._12_4_;
    auVar44._0_4_ = (float)local_308._0_4_ * (float)local_308._0_4_ * fVar122;
    auVar44._4_4_ = (float)local_308._4_4_ * (float)local_308._4_4_ * fVar127;
    auVar44._8_4_ = fStack_300 * fStack_300 * fVar129;
    auVar44._12_4_ = fStack_2fc * fStack_2fc * fVar131;
    auVar36 = vcmpps_avx(auVar37,auVar44,1);
    auVar45._0_4_ = fVar132 * -fVar81;
    auVar45._4_4_ = fVar136 * -fVar84;
    auVar45._8_4_ = fVar137 * -fVar85;
    auVar45._12_4_ = fVar138 * -fVar86;
    auVar36 = vblendvps_avx(auVar134,auVar45,auVar36);
    auVar32 = vblendvps_avx(auVar134,auVar36,auVar32);
    auVar45 = vminps_avx(auVar80,auVar32);
    auVar36 = vmaxps_avx(auVar80,auVar32);
    auVar57 = vminps_avx(auVar102,auVar45);
    auVar44 = vcmpps_avx(auVar57,auVar45,0);
    auVar32 = vcmpps_avx(auVar134,auVar36,0);
    auVar91._8_4_ = 0xff800000;
    auVar91._0_8_ = 0xff800000ff800000;
    auVar91._12_4_ = 0xff800000;
    auVar32 = vblendvps_avx(auVar36,auVar91,auVar32);
    auVar36 = vcmpps_avx(auVar134,auVar45,0);
    auVar36 = vblendvps_avx(auVar45,auVar91,auVar36);
    auVar32 = vblendvps_avx(auVar36,auVar32,auVar44);
    uVar1 = *(undefined4 *)(ray + k * 4 + 0x30);
    auVar60._4_4_ = uVar1;
    auVar60._0_4_ = uVar1;
    auVar60._8_4_ = uVar1;
    auVar60._12_4_ = uVar1;
    local_348 = vmaxps_avx(local_298,auVar32);
    auVar46._0_4_ = fVar54 + auVar57._0_4_;
    auVar46._4_4_ = fVar65 + auVar57._4_4_;
    auVar46._8_4_ = fStack_320 + auVar57._8_4_;
    auVar46._12_4_ = fStack_31c + auVar57._12_4_;
    auVar32 = vcmpps_avx(auVar60,auVar46,2);
    uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
    local_368._4_4_ = uVar1;
    local_368._0_4_ = uVar1;
    fStack_360 = (float)uVar1;
    fStack_35c = (float)uVar1;
    auVar36 = vcmpps_avx(auVar46,_local_368,2);
    auVar32 = vandps_avx(auVar32,auVar36);
    auVar36 = vcmpps_avx(auVar134,auVar57,4);
    local_48 = vandps_avx(auVar32,auVar36);
    auVar32 = vandps_avx(local_48,auVar42);
    local_338._0_4_ = local_348._0_4_ + fVar54;
    local_338._4_4_ = local_348._4_4_ + fVar65;
    local_338._8_4_ = local_348._8_4_ + fStack_320;
    local_338._12_4_ = local_348._12_4_ + fStack_31c;
    auVar36 = vcmpps_avx(auVar60,local_338,2);
    auVar44 = vcmpps_avx(local_338,_local_368,2);
    auVar36 = vandps_avx(auVar36,auVar44);
    auVar44 = vcmpps_avx(local_348,auVar91,4);
    auVar44 = vandps_avx(auVar42,auVar44);
    local_1f8 = vandps_avx(auVar36,auVar44);
    auVar36 = vorps_avx(auVar32,local_1f8);
    uVar25 = vmovmskps_avx(auVar36);
    if (uVar25 != 0) {
      auVar44 = vblendvps_avx(local_348,auVar57,auVar32);
      auVar45 = vblendvps_avx(_local_2a8,auVar35,auVar32);
      auVar24._4_4_ = fVar38;
      auVar24._0_4_ = fVar31;
      auVar24._8_4_ = fVar39;
      auVar24._12_4_ = fVar40;
      auVar32 = vrcpps_avx(auVar24);
      local_318 = auVar32._0_4_;
      auVar70._0_4_ = fVar31 * local_318;
      fStack_314 = auVar32._4_4_;
      auVar70._4_4_ = fVar38 * fStack_314;
      fStack_310 = auVar32._8_4_;
      auVar70._8_4_ = fVar39 * fStack_310;
      fStack_30c = auVar32._12_4_;
      auVar70._12_4_ = fVar40 * fStack_30c;
      auVar124._8_4_ = 0x3f800000;
      auVar124._0_8_ = 0x3f8000003f800000;
      auVar124._12_4_ = 0x3f800000;
      auVar32 = vsubps_avx(auVar124,auVar70);
      local_318 = local_318 + local_318 * auVar32._0_4_;
      fStack_314 = fStack_314 + fStack_314 * auVar32._4_4_;
      fStack_310 = fStack_310 + fStack_310 * auVar32._8_4_;
      fStack_30c = fStack_30c + fStack_30c * auVar32._12_4_;
      local_208 = fVar31 * fVar51 * local_208;
      fStack_204 = fVar38 * fVar12 * fStack_204;
      fStack_200 = fVar39 * fVar17 * fStack_200;
      fStack_1fc = fVar40 * fVar22 * fStack_1fc;
      local_288 = fVar115 * fVar87;
      fStack_284 = fVar53 * fVar94;
      fStack_280 = fVar14 * fVar95;
      fStack_27c = fVar19 * fVar96;
      auVar32 = vcmpps_avx(auVar44,auVar102,0);
      auVar36 = vcmpps_avx(local_298,auVar44,0);
      auVar32 = vorps_avx(auVar32,auVar36);
      auVar32 = vandps_avx(auVar42,auVar32);
      auVar36 = vcmpps_avx(auVar44,auVar80,0);
      auVar36 = vandps_avx(auVar42,auVar36);
      fVar51 = auVar44._0_4_;
      fVar12 = auVar44._4_4_;
      fVar17 = auVar44._8_4_;
      fVar22 = auVar44._12_4_;
      fStack_214 = fVar141 * fStack_204;
      local_218 = fVar116 * local_208;
      fStack_210 = fVar15 * fStack_200;
      fStack_20c = fVar20 * fStack_1fc;
      auVar61._0_4_ = fVar116 * local_208 + (float)local_b8._0_4_ * (local_1c8 * fVar51 + fVar121);
      auVar61._4_4_ = fVar141 * fStack_204 + (float)local_b8._4_4_ * (local_1c8 * fVar12 + fVar126);
      auVar61._8_4_ = fVar15 * fStack_200 + fStack_b0 * (local_1c8 * fVar17 + fVar128);
      auVar61._12_4_ = fVar20 * fStack_1fc + fStack_ac * (local_1c8 * fVar22 + fVar130);
      fStack_234 = fVar141 * fVar94;
      local_238 = fVar116 * fVar87;
      fStack_230 = fVar15 * fVar95;
      fStack_22c = fVar20 * fVar96;
      fVar31 = auVar45._0_4_;
      auVar77._0_4_ = fVar31 * fVar116 * fVar87;
      fVar116 = auVar45._4_4_;
      auVar77._4_4_ = fVar116 * fVar141 * fVar94;
      fVar141 = auVar45._8_4_;
      auVar77._8_4_ = fVar141 * fVar15 * fVar95;
      fVar38 = auVar45._12_4_;
      auVar77._12_4_ = fVar38 * fVar20 * fVar96;
      auVar45 = vsubps_avx(auVar61,auVar77);
      auVar151 = ZEXT1664(local_268);
      fStack_224 = fVar53 * fStack_204;
      local_228 = fVar115 * local_208;
      fStack_220 = fVar14 * fStack_200;
      fStack_21c = fVar19 * fStack_1fc;
      auVar78._0_4_ = fVar115 * local_208 + (float)local_b8._0_4_ * (fVar142 + local_a8 * fVar51);
      auVar78._4_4_ = fVar53 * fStack_204 + (float)local_b8._4_4_ * (fVar145 + local_a8 * fVar12);
      auVar78._8_4_ = fVar14 * fStack_200 + fStack_b0 * (fVar146 + local_a8 * fVar17);
      auVar78._12_4_ = fVar19 * fStack_1fc + fStack_ac * (fVar147 + local_a8 * fVar22);
      auVar109._0_4_ = fVar31 * local_288;
      auVar109._4_4_ = fVar116 * fStack_284;
      auVar109._8_4_ = fVar141 * fStack_280;
      auVar109._12_4_ = fVar38 * fStack_27c;
      auVar57 = vsubps_avx(auVar78,auVar109);
      local_68._0_8_ = local_1d8._0_8_ ^ 0x8000000080000000;
      local_68._8_4_ = -fVar15;
      local_68._12_4_ = -fVar20;
      auVar44 = vblendvps_avx(local_1d8,local_68,auVar36);
      local_188 = vblendvps_avx(auVar44,auVar45,auVar32);
      local_208 = fVar97 * local_208;
      fStack_204 = fVar52 * fStack_204;
      fStack_200 = fVar13 * fStack_200;
      fStack_1fc = fVar18 * fStack_1fc;
      auVar125 = ZEXT1664(CONCAT412(fVar18 * fVar96,
                                    CONCAT48(fVar13 * fVar95,
                                             CONCAT44(fVar52 * fVar94,fVar97 * fVar87))));
      auVar140 = ZEXT1664(local_278);
      auVar92._0_4_ = local_208 + (float)local_b8._0_4_ * (fVar41 + fVar51 * local_1e8);
      auVar92._4_4_ = fStack_204 + (float)local_b8._4_4_ * (fVar11 + fVar12 * local_1e8);
      auVar92._8_4_ = fStack_200 + fStack_b0 * (fVar16 + fVar17 * local_1e8);
      auVar92._12_4_ = fStack_1fc + fStack_ac * (fVar21 + fVar22 * local_1e8);
      auVar110._0_4_ = fVar97 * fVar87 * fVar31;
      auVar110._4_4_ = fVar52 * fVar94 * fVar116;
      auVar110._8_4_ = fVar13 * fVar95 * fVar141;
      auVar110._12_4_ = fVar18 * fVar96 * fVar38;
      local_78._0_8_ = local_248._0_8_ ^ 0x8000000080000000;
      local_78._8_4_ = -fVar14;
      local_78._12_4_ = -fVar19;
      auVar44 = vblendvps_avx(local_248,local_78,auVar36);
      auVar45 = vsubps_avx(auVar92,auVar110);
      local_178 = vblendvps_avx(auVar44,auVar57,auVar32);
      local_88._0_8_ = local_258._0_8_ ^ 0x8000000080000000;
      local_88._8_4_ = -fVar13;
      local_88._12_4_ = -fVar18;
      auVar44 = vblendvps_avx(local_258,local_88,auVar36);
      local_168 = vblendvps_avx(auVar44,auVar45,auVar32);
      auVar47._8_4_ = 0x3f800000;
      auVar47._0_8_ = 0x3f8000003f800000;
      auVar47._12_4_ = 0x3f800000;
      local_58 = vandnps_avx(auVar36,auVar47);
      auVar48._0_4_ = fVar31 * local_318;
      auVar48._4_4_ = fVar116 * fStack_314;
      auVar48._8_4_ = fVar141 * fStack_310;
      auVar48._12_4_ = fVar38 * fStack_30c;
      local_1b8 = vblendvps_avx(local_58,auVar48,auVar32);
      auVar135 = ZEXT1664(ZEXT816(0));
      local_1a8 = ZEXT816(0);
      local_198._4_4_ = fVar12 + fVar65;
      local_198._0_4_ = fVar51 + fVar54;
      fStack_190 = fVar17 + fStack_320;
      fStack_18c = fVar22 + fStack_31c;
      uVar30 = (ulong)(uVar25 & 0xff);
      pauVar28 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
      auVar114 = ZEXT1664(local_248);
      auVar120 = ZEXT1664(local_258);
      auVar144 = ZEXT1664(local_2f8);
      _local_308 = auVar102;
      fStack_1e4 = local_1e8;
      fStack_1e0 = local_1e8;
      fStack_1dc = local_1e8;
      fStack_1c4 = local_1c8;
      fStack_1c0 = local_1c8;
      fStack_1bc = local_1c8;
      do {
        local_2d8.hit = local_158;
        auVar36 = auVar120._0_16_;
        auVar32 = auVar114._0_16_;
        auVar44 = auVar125._0_16_;
        auVar45 = auVar140._0_16_;
        auVar57 = auVar151._0_16_;
        auVar102 = auVar144._0_16_;
        uVar10 = 0;
        if (uVar30 != 0) {
          for (; (uVar30 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
          }
        }
        uVar25 = *(uint *)(local_98 + uVar10 * 4);
        pGVar7 = (pSVar29->geometries).items[uVar25].ptr;
        local_2d8.ray = (RTCRayN *)ray;
        if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (bVar27 = true, pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0))
          goto LAB_00dd5e13;
          local_128 = *(undefined4 *)(local_1b8 + uVar10 * 4);
          uVar2 = *(undefined4 *)(local_1a8 + uVar10 * 4);
          auVar62._4_4_ = uVar2;
          auVar62._0_4_ = uVar2;
          auVar62._8_4_ = uVar2;
          auVar62._12_4_ = uVar2;
          *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_198 + uVar10 * 4);
          local_2d8.context = context->user;
          local_f8 = vpshufd_avx(ZEXT416(uVar25),0);
          uVar25 = (line->primIDs).field_0.i[uVar10];
          local_108._4_4_ = uVar25;
          local_108._0_4_ = uVar25;
          local_108._8_4_ = uVar25;
          local_108._12_4_ = uVar25;
          uVar2 = *(undefined4 *)(local_188 + uVar10 * 4);
          uVar3 = *(undefined4 *)(local_178 + uVar10 * 4);
          local_148._4_4_ = uVar3;
          local_148._0_4_ = uVar3;
          local_148._8_4_ = uVar3;
          local_148._12_4_ = uVar3;
          uVar3 = *(undefined4 *)(local_168 + uVar10 * 4);
          local_138._4_4_ = uVar3;
          local_138._0_4_ = uVar3;
          local_138._8_4_ = uVar3;
          local_138._12_4_ = uVar3;
          local_158[0] = (RTCHitN)(char)uVar2;
          local_158[1] = (RTCHitN)(char)((uint)uVar2 >> 8);
          local_158[2] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
          local_158[3] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
          local_158[4] = (RTCHitN)(char)uVar2;
          local_158[5] = (RTCHitN)(char)((uint)uVar2 >> 8);
          local_158[6] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
          local_158[7] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
          local_158[8] = (RTCHitN)(char)uVar2;
          local_158[9] = (RTCHitN)(char)((uint)uVar2 >> 8);
          local_158[10] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
          local_158[0xb] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
          local_158[0xc] = (RTCHitN)(char)uVar2;
          local_158[0xd] = (RTCHitN)(char)((uint)uVar2 >> 8);
          local_158[0xe] = (RTCHitN)(char)((uint)uVar2 >> 0x10);
          local_158[0xf] = (RTCHitN)(char)((uint)uVar2 >> 0x18);
          uStack_124 = local_128;
          uStack_120 = local_128;
          uStack_11c = local_128;
          local_118 = auVar62;
          auVar32 = ZEXT416(0) << 0x20;
          vcmpps_avx(ZEXT432(0) << 0x20,ZEXT432(0) << 0x20,0xf);
          uStack_e4 = (local_2d8.context)->instID[0];
          local_e8 = uStack_e4;
          uStack_e0 = uStack_e4;
          uStack_dc = uStack_e4;
          uStack_d8 = (local_2d8.context)->instPrimID[0];
          uStack_d4 = uStack_d8;
          uStack_d0 = uStack_d8;
          uStack_cc = uStack_d8;
          local_358 = *pauVar28;
          local_2d8.geometryUserPtr = pGVar7->userPtr;
          local_2d8.N = 4;
          local_c8 = auVar44;
          local_2e0 = pSVar29;
          local_2d8.valid = (int *)local_358;
          if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            local_328 = pauVar28;
            (*pGVar7->occlusionFilterN)(&local_2d8);
            auVar114._8_56_ = extraout_var;
            auVar114._0_8_ = extraout_XMM1_Qa;
            auVar32 = auVar114._0_16_;
            auVar135 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar125 = ZEXT1664(local_c8);
            auVar144 = ZEXT1664(local_2f8);
            auVar140 = ZEXT1664(local_278);
            auVar151 = ZEXT1664(local_268);
            auVar120 = ZEXT1664(local_258);
            auVar114 = ZEXT1664(local_248);
            pauVar28 = local_328;
          }
          if (local_358 == (undefined1  [16])0x0) {
            auVar33 = vpcmpeqd_avx(auVar135._0_16_,(undefined1  [16])0x0);
            auVar32 = vpcmpeqd_avx(auVar32,auVar32);
            auVar33 = auVar33 ^ auVar32;
          }
          else {
            p_Var9 = context->args->filter;
            auVar33 = vpcmpeqd_avx(auVar62,auVar62);
            if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var9)(&local_2d8);
              auVar33 = vpcmpeqd_avx(auVar33,auVar33);
              auVar135 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar125 = ZEXT1664(local_c8);
              auVar144 = ZEXT1664(local_2f8);
              auVar140 = ZEXT1664(local_278);
              auVar151 = ZEXT1664(local_268);
              auVar120 = ZEXT1664(local_258);
              auVar114 = ZEXT1664(local_248);
            }
            auVar32 = vpcmpeqd_avx(auVar135._0_16_,local_358);
            auVar33 = auVar32 ^ auVar33;
            auVar63._8_4_ = 0xff800000;
            auVar63._0_8_ = 0xff800000ff800000;
            auVar63._12_4_ = 0xff800000;
            auVar32 = vblendvps_avx(auVar63,*(undefined1 (*) [16])(local_2d8.ray + 0x80),auVar32);
            *(undefined1 (*) [16])(local_2d8.ray + 0x80) = auVar32;
          }
          auVar36 = auVar120._0_16_;
          auVar32 = auVar114._0_16_;
          auVar44 = auVar125._0_16_;
          auVar45 = auVar140._0_16_;
          auVar57 = auVar151._0_16_;
          auVar102 = auVar144._0_16_;
          auVar49._8_8_ = 0x100000001;
          auVar49._0_8_ = 0x100000001;
          if ((auVar49 & auVar33) != (undefined1  [16])0x0) {
            _local_368 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
            bVar27 = true;
            goto LAB_00dd5e13;
          }
          *(undefined4 *)(ray + k * 4 + 0x80) = uVar1;
          pSVar29 = local_2e0;
        }
        auVar36 = auVar120._0_16_;
        auVar32 = auVar114._0_16_;
        auVar44 = auVar125._0_16_;
        auVar45 = auVar140._0_16_;
        auVar57 = auVar151._0_16_;
        auVar102 = auVar144._0_16_;
        uVar30 = uVar30 ^ 1L << (uVar10 & 0x3f);
      } while (uVar30 != 0);
      bVar27 = false;
LAB_00dd5e13:
      local_328 = pauVar28;
      auVar33 = vpermilps_avx(_local_368,0);
      auVar42 = vcmpps_avx(local_338,auVar33,2);
      auVar33 = vandps_avx(local_1f8,local_48);
      auVar33 = vandps_avx(auVar33,auVar42);
      uVar25 = vmovmskps_avx(auVar33);
      if (uVar25 == 0) {
        return bVar27;
      }
      auVar33 = vcmpps_avx(local_348,auVar80,0);
      auVar80 = vblendvps_avx(local_1d8,local_68,auVar33);
      auVar32 = vblendvps_avx(auVar32,local_78,auVar33);
      auVar36 = vblendvps_avx(auVar36,local_88,auVar33);
      auVar33 = vcmpps_avx(local_348,_local_308,0);
      auVar42 = vcmpps_avx(local_348,local_298,0);
      auVar33 = vorps_avx(auVar33,auVar42);
      fVar97 = local_348._0_4_;
      fVar115 = local_348._4_4_;
      fVar116 = local_348._8_4_;
      fVar41 = local_348._12_4_;
      auVar79._0_4_ = (float)local_b8._0_4_ * (auVar102._0_4_ + fVar97 * local_1c8) + local_218;
      auVar79._4_4_ = (float)local_b8._4_4_ * (auVar102._4_4_ + fVar115 * fStack_1c4) + fStack_214;
      auVar79._8_4_ = fStack_b0 * (auVar102._8_4_ + fVar116 * fStack_1c0) + fStack_210;
      auVar79._12_4_ = fStack_ac * (auVar102._12_4_ + fVar41 * fStack_1bc) + fStack_20c;
      auVar83._0_4_ = (float)local_b8._0_4_ * (auVar57._0_4_ + fVar97 * local_a8) + local_228;
      auVar83._4_4_ = (float)local_b8._4_4_ * (auVar57._4_4_ + fVar115 * fStack_a4) + fStack_224;
      auVar83._8_4_ = fStack_b0 * (auVar57._8_4_ + fVar116 * fStack_a0) + fStack_220;
      auVar83._12_4_ = fStack_ac * (auVar57._12_4_ + fVar41 * fStack_9c) + fStack_21c;
      auVar93._0_4_ = (float)local_b8._0_4_ * (auVar45._0_4_ + fVar97 * local_1e8) + local_208;
      auVar93._4_4_ = (float)local_b8._4_4_ * (auVar45._4_4_ + fVar115 * fStack_1e4) + fStack_204;
      auVar93._8_4_ = fStack_b0 * (auVar45._8_4_ + fVar116 * fStack_1e0) + fStack_200;
      auVar93._12_4_ = fStack_ac * (auVar45._12_4_ + fVar41 * fStack_1dc) + fStack_1fc;
      auVar111._0_4_ = (float)local_2a8._0_4_ * local_238;
      auVar111._4_4_ = (float)local_2a8._4_4_ * fStack_234;
      auVar111._8_4_ = fStack_2a0 * fStack_230;
      auVar111._12_4_ = fStack_29c * fStack_22c;
      auVar45 = vsubps_avx(auVar79,auVar111);
      auVar112._0_4_ = (float)local_2a8._0_4_ * local_288;
      auVar112._4_4_ = (float)local_2a8._4_4_ * fStack_284;
      auVar112._8_4_ = fStack_2a0 * fStack_280;
      auVar112._12_4_ = fStack_29c * fStack_27c;
      auVar102 = vsubps_avx(auVar83,auVar112);
      auVar113._0_4_ = auVar44._0_4_ * (float)local_2a8._0_4_;
      auVar113._4_4_ = auVar44._4_4_ * (float)local_2a8._4_4_;
      auVar113._8_4_ = auVar44._8_4_ * fStack_2a0;
      auVar113._12_4_ = auVar44._12_4_ * fStack_29c;
      auVar57 = vsubps_avx(auVar93,auVar113);
      local_188 = vblendvps_avx(auVar80,auVar45,auVar33);
      local_178 = vblendvps_avx(auVar32,auVar102,auVar33);
      local_168 = vblendvps_avx(auVar36,auVar57,auVar33);
      auVar80._0_4_ = (float)local_2a8._0_4_ * local_318;
      auVar80._4_4_ = (float)local_2a8._4_4_ * fStack_314;
      auVar80._8_4_ = fStack_2a0 * fStack_310;
      auVar80._12_4_ = fStack_29c * fStack_30c;
      local_1b8 = vblendvps_avx(local_58,auVar80,auVar33);
      auVar114 = ZEXT464(0) << 0x20;
      local_1a8 = ZEXT416(0) << 0x20;
      _local_198 = local_338;
      pSVar29 = context->scene;
      uVar30 = (ulong)(uVar25 & 0xff);
      auVar120 = ZEXT864(0) << 0x20;
      auVar32 = vpcmpeqd_avx(auVar44,auVar44);
      auVar125 = ZEXT1664(auVar32);
      do {
        local_2d8.hit = local_158;
        local_2d8.valid = (int *)local_358;
        uVar10 = 0;
        if (uVar30 != 0) {
          for (; (uVar30 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
          }
        }
        uVar25 = *(uint *)(local_98 + uVar10 * 4);
        pGVar7 = (pSVar29->geometries).items[uVar25].ptr;
        if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (bVar26 = 1, pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_00dd6206;
          local_128 = *(undefined4 *)(local_1b8 + uVar10 * 4);
          uVar1 = *(undefined4 *)(local_1a8 + uVar10 * 4);
          local_118._4_4_ = uVar1;
          local_118._0_4_ = uVar1;
          local_118._8_4_ = uVar1;
          local_118._12_4_ = uVar1;
          *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_198 + uVar10 * 4);
          local_2d8.context = context->user;
          local_f8 = vpshufd_avx(ZEXT416(uVar25),0);
          uVar25 = (line->primIDs).field_0.i[uVar10];
          local_108._4_4_ = uVar25;
          local_108._0_4_ = uVar25;
          local_108._8_4_ = uVar25;
          local_108._12_4_ = uVar25;
          uVar1 = *(undefined4 *)(local_188 + uVar10 * 4);
          uVar2 = *(undefined4 *)(local_178 + uVar10 * 4);
          local_148._4_4_ = uVar2;
          local_148._0_4_ = uVar2;
          local_148._8_4_ = uVar2;
          local_148._12_4_ = uVar2;
          uVar2 = *(undefined4 *)(local_168 + uVar10 * 4);
          local_138._4_4_ = uVar2;
          local_138._0_4_ = uVar2;
          local_138._8_4_ = uVar2;
          local_138._12_4_ = uVar2;
          local_158[0] = (RTCHitN)(char)uVar1;
          local_158[1] = (RTCHitN)(char)((uint)uVar1 >> 8);
          local_158[2] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
          local_158[3] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
          local_158[4] = (RTCHitN)(char)uVar1;
          local_158[5] = (RTCHitN)(char)((uint)uVar1 >> 8);
          local_158[6] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
          local_158[7] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
          local_158[8] = (RTCHitN)(char)uVar1;
          local_158[9] = (RTCHitN)(char)((uint)uVar1 >> 8);
          local_158[10] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
          local_158[0xb] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
          local_158[0xc] = (RTCHitN)(char)uVar1;
          local_158[0xd] = (RTCHitN)(char)((uint)uVar1 >> 8);
          local_158[0xe] = (RTCHitN)(char)((uint)uVar1 >> 0x10);
          local_158[0xf] = (RTCHitN)(char)((uint)uVar1 >> 0x18);
          uStack_124 = local_128;
          uStack_120 = local_128;
          uStack_11c = local_128;
          vcmpps_avx(auVar120._0_32_,auVar120._0_32_,0xf);
          uStack_e4 = (local_2d8.context)->instID[0];
          local_e8 = uStack_e4;
          uStack_e0 = uStack_e4;
          uStack_dc = uStack_e4;
          uStack_d8 = (local_2d8.context)->instPrimID[0];
          uStack_d4 = uStack_d8;
          uStack_d0 = uStack_d8;
          uStack_cc = uStack_d8;
          local_358 = *local_328;
          local_2d8.geometryUserPtr = pGVar7->userPtr;
          local_2d8.N = 4;
          local_2d8.ray = (RTCRayN *)ray;
          if (pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0) {
            auVar32 = auVar125._0_16_;
            (*pGVar7->occlusionFilterN)(&local_2d8);
            auVar32 = vpcmpeqd_avx(auVar32,auVar32);
            auVar125 = ZEXT1664(auVar32);
            auVar120 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar114 = ZEXT1664(ZEXT816(0) << 0x40);
          }
          auVar32 = auVar125._0_16_;
          if (local_358 == (undefined1  [16])0x0) {
            auVar36 = vpcmpeqd_avx((undefined1  [16])0x0,auVar114._0_16_);
            auVar32 = auVar32 ^ auVar36;
          }
          else {
            p_Var9 = context->args->filter;
            if ((p_Var9 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar7->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var9)(&local_2d8);
              auVar32 = vpcmpeqd_avx(auVar32,auVar32);
              auVar125 = ZEXT1664(auVar32);
              auVar120 = ZEXT1664(ZEXT816(0) << 0x40);
              auVar114 = ZEXT1664(ZEXT816(0) << 0x40);
            }
            auVar36 = vpcmpeqd_avx(local_358,auVar114._0_16_);
            auVar32 = auVar125._0_16_ ^ auVar36;
            auVar64._8_4_ = 0xff800000;
            auVar64._0_8_ = 0xff800000ff800000;
            auVar64._12_4_ = 0xff800000;
            auVar36 = vblendvps_avx(auVar64,*(undefined1 (*) [16])(local_2d8.ray + 0x80),auVar36);
            *(undefined1 (*) [16])(local_2d8.ray + 0x80) = auVar36;
          }
          auVar50._8_8_ = 0x100000001;
          auVar50._0_8_ = 0x100000001;
          if ((auVar50 & auVar32) != (undefined1  [16])0x0) {
            bVar26 = 1;
            goto LAB_00dd6206;
          }
          *(undefined4 *)(ray + k * 4 + 0x80) = local_368._0_4_;
        }
        uVar30 = uVar30 ^ 1L << (uVar10 & 0x3f);
        if (uVar30 == 0) {
          bVar26 = 0;
LAB_00dd6206:
          return (bool)(bVar27 | bVar26);
        }
      } while( true );
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(const Precalculations& pre, RayK<K>& ray, size_t k, RayQueryContext* context, const Primitive& line)
      {
        STAT3(shadow.trav_prims,1,1,1);
        const LineSegments* geom = context->scene->get<LineSegments>(line.geomID());
        Vec4vf<M> v0,v1; 
        vbool<M> cL,cR;
        line.gather(v0,v1,cL,cR,geom);
        const vbool<M> valid = line.valid();
        return ConeCurveIntersectorK<M,K>::intersect(valid,ray,k,context,geom,pre,v0,v1,cL,cR,Occluded1KEpilogM<M,K,filter>(ray,k,context,line.geomID(),line.primID()));
      }